

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::DrawRect(FloatRect *rect,Color *color,float rounding,int rounding_corners,
                    float thickness)

{
  ImU32 col;
  ImDrawList *this;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  this = GetWindowDrawList();
  local_40 = anon_unknown.dwarf_115aec::getTopLeftAbsolute(rect);
  local_48 = anon_unknown.dwarf_115aec::getDownRightAbsolute(rect);
  local_38 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*color);
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddRect(this,&local_40,&local_48,col,rounding,rounding_corners,thickness);
  return;
}

Assistant:

void DrawRect(const sf::FloatRect& rect, const sf::Color& color, float rounding,
              int rounding_corners, float thickness) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    draw_list->AddRect(getTopLeftAbsolute(rect), getDownRightAbsolute(rect),
                       ColorConvertFloat4ToU32(toImColor(color)), rounding, rounding_corners,
                       thickness);
}